

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

uint cpu_extended_feature_bits(void)

{
  int iVar1;
  ulong local_28;
  uint32_t regs [4];
  uint local_c;
  uint features;
  
  local_c = 0;
  local_28 = 7;
  regs[0] = 0;
  regs[1] = 0;
  iVar1 = execute_cpuid((uint32_t *)&local_28);
  if (iVar1 != 0) {
    if ((local_28 & 0x2000000000) != 0) {
      local_c = 0x20;
    }
    if ((local_28 & 0x1000000000000) != 0) {
      local_c = local_c | 0x40;
    }
  }
  return local_c;
}

Assistant:

PRIVATE unsigned int
cpu_extended_feature_bits(void)
{
  unsigned int  features = VRNA_CPU_SIMD_NONE;

  uint32_t      regs[4] = {
    7, 0, 0, 0
  };

  if (execute_cpuid(&regs[0])) {
    if (regs[1] & bit_AVX2)
      features |= VRNA_CPU_SIMD_AVX2;

    if (regs[1] & bit_AVX512F)
      features |= VRNA_CPU_SIMD_AVX512F;
  }

  return features;
}